

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.c
# Opt level: O0

Tag * Tag_new(Location_conflict location,IdGenerator *id_generator,wchar_t *name)

{
  Tag *pTVar1;
  wchar_t *pwVar2;
  Tag *tag;
  wchar_t *name_local;
  IdGenerator *id_generator_local;
  Location_conflict location_local;
  
  pTVar1 = (Tag *)malloc(0x28);
  pTVar1->tag_delete = Tag_delete;
  pTVar1->type = Gherkin_Tag;
  id_generator_local._0_4_ = location.line;
  (pTVar1->location).line = (int)id_generator_local;
  id_generator_local._4_4_ = location.column;
  (pTVar1->location).column = id_generator_local._4_4_;
  pwVar2 = (*id_generator->new_id)(id_generator);
  pTVar1->id = pwVar2;
  if (name != (wchar_t *)0x0) {
    pwVar2 = StringUtilities_copy_string(name);
    pTVar1->name = pwVar2;
  }
  return pTVar1;
}

Assistant:

const Tag* Tag_new(Location location, IdGenerator* id_generator, const wchar_t* name) {
    Tag* tag = (Tag*)malloc(sizeof(Tag));
    tag->tag_delete = (item_delete_function)Tag_delete;
    tag->type = Gherkin_Tag;
    tag->location.line = location.line;
    tag->location.column = location.column;
    tag->id = id_generator->new_id(id_generator);
    if (name) {
        tag->name = StringUtilities_copy_string(name);
    }
    return tag;
}